

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_ls.c
# Opt level: O3

int CVodeGetNumLinConvFails(void *cvode_mem,long *nlcfails)

{
  int iVar1;
  CVLsMem cvls_mem;
  CVodeMem cv_mem;
  CVLsMem local_18;
  CVodeMem local_10;
  
  iVar1 = cvLs_AccessLMem(cvode_mem,"CVodeGetNumLinConvFails",&local_10,&local_18);
  if (iVar1 == 0) {
    *nlcfails = local_18->ncfl;
  }
  return iVar1;
}

Assistant:

int CVodeGetNumLinConvFails(void* cvode_mem, long int* nlcfails)
{
  CVodeMem cv_mem;
  CVLsMem cvls_mem;
  int retval;

  /* access CVLsMem structure; set output value and return */
  retval = cvLs_AccessLMem(cvode_mem, __func__, &cv_mem, &cvls_mem);
  if (retval != CVLS_SUCCESS) { return (retval); }
  *nlcfails = cvls_mem->ncfl;
  return (CVLS_SUCCESS);
}